

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O3

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,ReadStream *r)

{
  Expression *pEVar1;
  CodePrinter *pCVar2;
  string *psVar3;
  long lVar4;
  size_t sVar5;
  char *__s;
  string_view text;
  string_view text_00;
  string_view text_01;
  
  pEVar1 = (r->super_Assignment).target.object;
  if (pEVar1 != (Expression *)0x0) {
    pCVar2 = this->out;
    lVar4 = __dynamic_cast(pEVar1,&Expression::typeinfo,&Variable::typeinfo,0);
    if ((lVar4 == 0) || (*(int *)(lVar4 + 0x38) != 2)) {
      __s = "";
    }
    else {
      __s = "let ";
    }
    sVar5 = strlen(__s);
    text._M_str = __s;
    text._M_len = sVar5;
    choc::text::CodePrinter::writeBlock(pCVar2,text);
    pEVar1 = (r->super_Assignment).target.object;
    if (pEVar1 != (Expression *)0x0) {
      printExpression(this,pEVar1);
      pCVar2 = this->out;
      text_00._M_str = " = read ";
      text_00._M_len = 8;
      choc::text::CodePrinter::writeBlock(pCVar2,text_00);
      psVar3 = (((r->source).object)->super_IODeclaration).name.name;
      if (psVar3 != (string *)0x0) {
        text_01._M_str = (psVar3->_M_dataplus)._M_p;
        text_01._M_len = psVar3->_M_string_length;
        choc::text::CodePrinter::writeBlock(pCVar2,text_01);
        return;
      }
      throwInternalCompilerError("isValid()","toString",0x23);
    }
  }
  throwInternalCompilerError("object != nullptr","operator*",0x3b);
}

Assistant:

void printDescription (const heart::ReadStream& r)
        {
            out << getAssignmentRole (*r.target);
            printExpression (*r.target);
            out << " = read " << r.source->name.toString();
        }